

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramid.cc
# Opt level: O2

void __thiscall ParamIDAnalysis::saveXml(ParamIDAnalysis *this,ostream *s,bool moredetail)

{
  long val;
  list<ParamMeasure,_std::allocator<ParamMeasure>_> *plVar1;
  _List_node_base *p_Var2;
  allocator local_ba;
  allocator local_b9;
  string local_b8;
  ParamIDAnalysis *local_98;
  string local_90;
  string local_70;
  string local_50;
  
  std::operator<<(s,"<parammeasures");
  std::__cxx11::string::string((string *)&local_b8,"name",(allocator *)&local_90);
  a_v(s,&local_b8,&this->fd->name);
  std::__cxx11::string::~string((string *)&local_b8);
  std::operator<<(s,">\n  ");
  Address::saveXml(&this->fd->baseaddr,s);
  std::operator<<(s,"\n  <proto");
  std::__cxx11::string::string((string *)&local_b8,"model",(allocator *)&local_90);
  a_v(s,&local_b8,&((this->fd->funcp).model)->name);
  std::__cxx11::string::~string((string *)&local_b8);
  val = (long)(this->fd->funcp).extrapop;
  if (val == 0x8000) {
    std::__cxx11::string::string((string *)&local_b8,"extrapop",&local_b9);
    std::__cxx11::string::string((string *)&local_90,"unknown",&local_ba);
    a_v(s,&local_b8,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
  }
  else {
    std::__cxx11::string::string((string *)&local_b8,"extrapop",(allocator *)&local_90);
    a_v_i(s,&local_b8,val);
  }
  std::__cxx11::string::~string((string *)&local_b8);
  std::operator<<(s,"/>\n");
  p_Var2 = (_List_node_base *)&this->InputParamMeasures;
  local_98 = this;
  while (p_Var2 = (((_List_base<ParamMeasure,_std::allocator<ParamMeasure>_> *)&p_Var2->_M_next)->
                  _M_impl)._M_node.super__List_node_base._M_next,
        p_Var2 != (_List_node_base *)&this->InputParamMeasures) {
    std::operator<<(s,"  ");
    std::__cxx11::string::string((string *)&local_50,"input",(allocator *)&local_b8);
    ParamMeasure::saveXml((ParamMeasure *)(p_Var2 + 1),s,&local_50,moredetail);
    std::__cxx11::string::~string((string *)&local_50);
  }
  plVar1 = &local_98->OutputParamMeasures;
  p_Var2 = (_List_node_base *)plVar1;
  while (p_Var2 = (((_List_base<ParamMeasure,_std::allocator<ParamMeasure>_> *)&p_Var2->_M_next)->
                  _M_impl)._M_node.super__List_node_base._M_next,
        p_Var2 != (_List_node_base *)plVar1) {
    std::operator<<(s,"  ");
    std::__cxx11::string::string((string *)&local_70,"output",(allocator *)&local_b8);
    ParamMeasure::saveXml((ParamMeasure *)(p_Var2 + 1),s,&local_70,moredetail);
    std::__cxx11::string::~string((string *)&local_70);
  }
  std::operator<<(s,"</parammeasures>");
  std::operator<<(s,"\n");
  return;
}

Assistant:

void ParamIDAnalysis::saveXml( ostream &s,bool moredetail ) const

{
  s << "<parammeasures";
  a_v( s, "name", fd->getName() );
  s << ">\n  ";
  fd->getAddress().saveXml( s );
  s << "\n  <proto";

  a_v(s,"model", fd->getFuncProto().getModelName());
  int4 extrapop = fd->getFuncProto().getExtraPop();
  if (extrapop == ProtoModel::extrapop_unknown)
    a_v(s,"extrapop","unknown");
  else
    a_v_i(s,"extrapop",extrapop);
  s << "/>\n";
  list<ParamMeasure>::const_iterator pm_iter;
  for( pm_iter = InputParamMeasures.begin(); pm_iter != InputParamMeasures.end(); ++pm_iter) {
    const ParamMeasure &pm( *pm_iter );
    s << "  ";
    pm.saveXml(s,"input",moredetail);
  }
  for( pm_iter = OutputParamMeasures.begin(); pm_iter != OutputParamMeasures.end() ; ++pm_iter) {
    const ParamMeasure &pm( *pm_iter );
    s << "  ";
    pm.saveXml( s, "output", moredetail );
  }
  s << "</parammeasures>";
  s << "\n";
}